

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_cohomology_unit_test.cpp
# Opt level: O0

void test_persistence_with_coeff_field(int coeff_field)

{
  undefined8 uVar1;
  undefined4 coefficient;
  bool bVar2;
  int min_persistence;
  ostream *poVar3;
  long lVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_1630;
  basic_cstring<const_char> local_1620;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1610;
  assertion_result local_15f0;
  basic_cstring<const_char> local_15d8;
  basic_cstring<const_char> local_15c8;
  basic_cstring<const_char> local_15b8;
  basic_cstring<const_char> local_15a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1598;
  assertion_result local_1578;
  basic_cstring<const_char> local_1560;
  basic_cstring<const_char> local_1550;
  basic_cstring<const_char> local_1540;
  basic_cstring<const_char> local_1530;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1520;
  assertion_result local_1500;
  basic_cstring<const_char> local_14e8;
  basic_cstring<const_char> local_14d8;
  basic_cstring<const_char> local_14c8;
  basic_cstring<const_char> local_14b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_14a8;
  assertion_result local_1488;
  basic_cstring<const_char> local_1470;
  basic_cstring<const_char> local_1460;
  basic_cstring<const_char> local_1450;
  basic_cstring<const_char> local_1440;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1430;
  assertion_result local_1410;
  basic_cstring<const_char> local_13f8;
  basic_cstring<const_char> local_13e8;
  basic_cstring<const_char> local_13d8;
  basic_cstring<const_char> local_13c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_13b8;
  assertion_result local_1398;
  basic_cstring<const_char> local_1380;
  basic_cstring<const_char> local_1370;
  basic_cstring<const_char> local_1360;
  basic_cstring<const_char> local_1350;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1340;
  assertion_result local_1320;
  basic_cstring<const_char> local_1308;
  basic_cstring<const_char> local_12f8;
  basic_cstring<const_char> local_12e8;
  basic_cstring<const_char> local_12d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_12c8;
  assertion_result local_12a8;
  basic_cstring<const_char> local_1290;
  basic_cstring<const_char> local_1280;
  basic_cstring<const_char> local_1270;
  basic_cstring<const_char> local_1260;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1250;
  assertion_result local_1230;
  basic_cstring<const_char> local_1218;
  basic_cstring<const_char> local_1208;
  basic_cstring<const_char> local_11f8;
  basic_cstring<const_char> local_11e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_11d8;
  assertion_result local_11b8;
  basic_cstring<const_char> local_11a0;
  basic_cstring<const_char> local_1190;
  string local_1180;
  basic_cstring<const_char> local_1160;
  basic_cstring<const_char> local_1150;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1140;
  assertion_result local_1120;
  basic_cstring<const_char> local_1108;
  basic_cstring<const_char> local_10f8;
  basic_cstring<const_char> local_10e8;
  basic_cstring<const_char> local_10d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_10c8;
  assertion_result local_10a8;
  basic_cstring<const_char> local_1090;
  basic_cstring<const_char> local_1080;
  basic_cstring<const_char> local_1070;
  basic_cstring<const_char> local_1060;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1050;
  assertion_result local_1030;
  basic_cstring<const_char> local_1018;
  basic_cstring<const_char> local_1008;
  basic_cstring<const_char> local_ff8;
  basic_cstring<const_char> local_fe8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_fd8;
  assertion_result local_fb8;
  basic_cstring<const_char> local_fa0;
  basic_cstring<const_char> local_f90;
  basic_cstring<const_char> local_f80;
  basic_cstring<const_char> local_f70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f60;
  assertion_result local_f40;
  basic_cstring<const_char> local_f28;
  basic_cstring<const_char> local_f18;
  basic_cstring<const_char> local_f08;
  basic_cstring<const_char> local_ef8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_ee8;
  assertion_result local_ec8;
  basic_cstring<const_char> local_eb0;
  basic_cstring<const_char> local_ea0;
  basic_cstring<const_char> local_e90;
  basic_cstring<const_char> local_e80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e70;
  assertion_result local_e50;
  basic_cstring<const_char> local_e38;
  basic_cstring<const_char> local_e28;
  basic_cstring<const_char> local_e18;
  basic_cstring<const_char> local_e08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_df8;
  assertion_result local_dd8;
  basic_cstring<const_char> local_dc0;
  basic_cstring<const_char> local_db0;
  basic_cstring<const_char> local_da0;
  basic_cstring<const_char> local_d90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d80;
  assertion_result local_d60;
  basic_cstring<const_char> local_d48;
  basic_cstring<const_char> local_d38;
  basic_cstring<const_char> local_d28;
  basic_cstring<const_char> local_d18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d08;
  assertion_result local_ce8;
  basic_cstring<const_char> local_cd0;
  basic_cstring<const_char> local_cc0;
  string local_cb0;
  basic_cstring<const_char> local_c90;
  basic_cstring<const_char> local_c80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c70;
  assertion_result local_c50;
  basic_cstring<const_char> local_c38;
  basic_cstring<const_char> local_c28;
  basic_cstring<const_char> local_c18;
  basic_cstring<const_char> local_c08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_bf8;
  assertion_result local_bd8;
  basic_cstring<const_char> local_bc0;
  basic_cstring<const_char> local_bb0;
  basic_cstring<const_char> local_ba0;
  basic_cstring<const_char> local_b90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b80;
  assertion_result local_b60;
  basic_cstring<const_char> local_b48;
  basic_cstring<const_char> local_b38;
  basic_cstring<const_char> local_b28;
  basic_cstring<const_char> local_b18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b08;
  assertion_result local_ae8;
  basic_cstring<const_char> local_ad0;
  basic_cstring<const_char> local_ac0;
  basic_cstring<const_char> local_ab0;
  basic_cstring<const_char> local_aa0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a90;
  assertion_result local_a70;
  basic_cstring<const_char> local_a58;
  basic_cstring<const_char> local_a48;
  basic_cstring<const_char> local_a38;
  basic_cstring<const_char> local_a28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a18;
  assertion_result local_9f8;
  basic_cstring<const_char> local_9e0;
  basic_cstring<const_char> local_9d0;
  basic_cstring<const_char> local_9c0;
  basic_cstring<const_char> local_9b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9a0;
  assertion_result local_980;
  basic_cstring<const_char> local_968;
  basic_cstring<const_char> local_958;
  basic_cstring<const_char> local_948;
  basic_cstring<const_char> local_938;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_928;
  assertion_result local_908;
  basic_cstring<const_char> local_8f0;
  basic_cstring<const_char> local_8e0;
  basic_cstring<const_char> local_8d0;
  basic_cstring<const_char> local_8c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_8b0;
  assertion_result local_890;
  basic_cstring<const_char> local_878;
  basic_cstring<const_char> local_868;
  basic_cstring<const_char> local_858;
  basic_cstring<const_char> local_848;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_838;
  assertion_result local_818;
  basic_cstring<const_char> local_800;
  basic_cstring<const_char> local_7f0;
  string local_7e0;
  basic_cstring<const_char> local_7c0;
  basic_cstring<const_char> local_7b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7a0;
  assertion_result local_780;
  basic_cstring<const_char> local_768;
  basic_cstring<const_char> local_758;
  basic_cstring<const_char> local_748;
  basic_cstring<const_char> local_738;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_728;
  assertion_result local_708;
  basic_cstring<const_char> local_6f0;
  basic_cstring<const_char> local_6e0;
  basic_cstring<const_char> local_6d0;
  basic_cstring<const_char> local_6c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6b0;
  assertion_result local_690;
  basic_cstring<const_char> local_678;
  basic_cstring<const_char> local_668;
  basic_cstring<const_char> local_658;
  basic_cstring<const_char> local_648;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_638;
  assertion_result local_618;
  basic_cstring<const_char> local_600;
  basic_cstring<const_char> local_5f0;
  basic_cstring<const_char> local_5e0;
  basic_cstring<const_char> local_5d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5c0;
  assertion_result local_5a0;
  basic_cstring<const_char> local_588;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  basic_cstring<const_char> local_558;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_548;
  assertion_result local_528;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4d0;
  assertion_result local_4b0;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  basic_cstring<const_char> local_468;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_458;
  assertion_result local_438;
  basic_cstring<const_char> local_420;
  basic_cstring<const_char> local_410;
  basic_cstring<const_char> local_400;
  basic_cstring<const_char> local_3f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3e0;
  assertion_result local_3c0;
  basic_cstring<const_char> local_3a8;
  basic_cstring<const_char> local_398;
  basic_cstring<const_char> local_388;
  basic_cstring<const_char> local_378;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_368;
  assertion_result local_348;
  basic_cstring<const_char> local_330;
  basic_cstring<const_char> local_320;
  undefined1 local_310 [8];
  string str_persistence;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8 [8];
  string value9;
  string local_180 [8];
  string value8;
  string local_158 [8];
  string value7;
  string local_130 [8];
  string value6;
  string local_108 [8];
  string value5;
  string local_e0 [8];
  string value4;
  string local_b8 [8];
  string value3;
  string local_90 [8];
  string value2;
  string local_68 [8];
  string value1;
  allocator<char> local_31;
  string local_30 [8];
  string value0;
  int coeff_field_local;
  
  value0.field_2._12_4_ = coeff_field;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"  0 0.02 1.12",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"  0 0.03 1.13",(allocator<char> *)(value2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(value2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"  0 0.04 1.14",(allocator<char> *)(value3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(value3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"  0 0.05 1.15",(allocator<char> *)(value4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(value4.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,"  0 0.06 1.16",(allocator<char> *)(value5.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(value5.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"  0 0.07 1.17",(allocator<char> *)(value6.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(value6.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"  0 0.08 1.18",(allocator<char> *)(value7.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(value7.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"  0 0.09 1.19",(allocator<char> *)(value8.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(value8.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"  0 0 inf",(allocator<char> *)(value9.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(value9.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"  0 0.01 inf",&local_1a9);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::to_string(&local_1d0,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_30,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::to_string(&local_1f0,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_68,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::to_string(&local_210,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_90,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::to_string(&local_230,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_b8,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::to_string(&local_250,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_e0,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::to_string(&local_270,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_108,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::to_string(&local_290,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_130,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::to_string(&local_2b0,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_158,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::to_string(&local_2d0,value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_180,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::to_string((string *)((long)&str_persistence.field_2 + 8),value0.field_2._12_4_);
  std::__cxx11::string::insert((ulong)local_1a8,(string *)0x0);
  std::__cxx11::string::~string((string *)(str_persistence.field_2._M_local_buf + 8));
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,value0.field_2._12_4_);
  poVar3 = std::operator<<(poVar3," MIN_PERS=0");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  test_persistence_abi_cxx11_((string *)local_310,value0.field_2._12_4_,0);
  poVar3 = std::operator<<((ostream *)&std::clog,(string *)local_310);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_330);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_320,0x55,&local_330);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_348,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_378,"str_persistence.find(value0) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_368,plVar5,&local_378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_348,&local_368,&local_388,0x55,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_368);
    boost::test_tools::assertion_result::~assertion_result(&local_348);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_398,0x56,&local_3a8);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_3c0,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f0,"str_persistence.find(value1) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_3e0,plVar5,&local_3f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_400,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_3c0,&local_3e0,&local_400,0x56,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3e0);
    boost::test_tools::assertion_result::~assertion_result(&local_3c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_410,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_420);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_410,0x57,&local_420);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_90);
    boost::test_tools::assertion_result::assertion_result(&local_438,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_468,"str_persistence.find(value2) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_458,plVar5,&local_468);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_438,&local_458,&local_478,0x57,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_458);
    boost::test_tools::assertion_result::~assertion_result(&local_438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_498);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_488,0x58,&local_498);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_4b0,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,"str_persistence.find(value3) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_4d0,plVar5,&local_4e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_4b0,&local_4d0,&local_4f0,0x58,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4d0);
    boost::test_tools::assertion_result::~assertion_result(&local_4b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_510);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_500,0x59,&local_510);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_e0);
    boost::test_tools::assertion_result::assertion_result(&local_528,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_558,"str_persistence.find(value4) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_548,plVar5,&local_558);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_568,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_528,&local_548,&local_568,0x59,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_548);
    boost::test_tools::assertion_result::~assertion_result(&local_528);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_578,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_588);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_578,0x5a,&local_588);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_108);
    boost::test_tools::assertion_result::assertion_result(&local_5a0,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d0,"str_persistence.find(value5) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_5c0,plVar5,&local_5d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_5a0,&local_5c0,&local_5e0,0x5a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_5c0);
    boost::test_tools::assertion_result::~assertion_result(&local_5a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_600);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5f0,0x5b,&local_600);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_130);
    boost::test_tools::assertion_result::assertion_result(&local_618,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_648,"str_persistence.find(value6) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_638,plVar5,&local_648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_618,&local_638,&local_658,0x5b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_638);
    boost::test_tools::assertion_result::~assertion_result(&local_618);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_668,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_678);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_668,0x5c,&local_678);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_158);
    boost::test_tools::assertion_result::assertion_result(&local_690,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6c0,"str_persistence.find(value7) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_6b0,plVar5,&local_6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_690,&local_6b0,&local_6d0,0x5c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6b0);
    boost::test_tools::assertion_result::~assertion_result(&local_690);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6e0,0x5d,&local_6f0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_180);
    boost::test_tools::assertion_result::assertion_result(&local_708,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_738,"str_persistence.find(value8) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_728,plVar5,&local_738);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_748,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_708,&local_728,&local_748,0x5d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_728);
    boost::test_tools::assertion_result::~assertion_result(&local_708);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_758,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_768);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_758,0x5e,&local_768);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_1a8);
    boost::test_tools::assertion_result::assertion_result(&local_780,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7b0,"str_persistence.find(value9) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_7a0,plVar5,&local_7b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_780,&local_7a0,&local_7c0,0x5e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7a0);
    boost::test_tools::assertion_result::~assertion_result(&local_780);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar3 = std::operator<<((ostream *)&std::clog,"str_persistence=");
  poVar3 = std::operator<<(poVar3,(string *)local_310);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,value0.field_2._12_4_);
  poVar3 = std::operator<<(poVar3," MIN_PERS=1");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  test_persistence_abi_cxx11_(&local_7e0,value0.field_2._12_4_,1);
  std::__cxx11::string::operator=((string *)local_310,(string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_800);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7f0,0x66,&local_800);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_818,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_848,"str_persistence.find(value0) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_838,plVar5,&local_848);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_858,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_818,&local_838,&local_858,0x66,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_838);
    boost::test_tools::assertion_result::~assertion_result(&local_818);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_868,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_878);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_868,0x67,&local_878);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_890,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8c0,"str_persistence.find(value1) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_8b0,plVar5,&local_8c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_890,&local_8b0,&local_8d0,0x67,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_8b0);
    boost::test_tools::assertion_result::~assertion_result(&local_890);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8e0,0x68,&local_8f0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_90);
    boost::test_tools::assertion_result::assertion_result(&local_908,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_938,"str_persistence.find(value2) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_928,plVar5,&local_938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_948,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_908,&local_928,&local_948,0x68,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_928);
    boost::test_tools::assertion_result::~assertion_result(&local_908);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_958,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_968);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_958,0x69,&local_968);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_980,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b0,"str_persistence.find(value3) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_9a0,plVar5,&local_9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_980,&local_9a0,&local_9c0,0x69,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9a0);
    boost::test_tools::assertion_result::~assertion_result(&local_980);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9d0,0x6a,&local_9e0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_e0);
    boost::test_tools::assertion_result::assertion_result(&local_9f8,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a28,"str_persistence.find(value4) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_a18,plVar5,&local_a28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_9f8,&local_a18,&local_a38,0x6a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a18);
    boost::test_tools::assertion_result::~assertion_result(&local_9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a48,0x6b,&local_a58);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_108);
    boost::test_tools::assertion_result::assertion_result(&local_a70,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_aa0,"str_persistence.find(value5) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_a90,plVar5,&local_aa0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_a70,&local_a90,&local_ab0,0x6b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a90);
    boost::test_tools::assertion_result::~assertion_result(&local_a70);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ac0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ad0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ac0,0x6c,&local_ad0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_130);
    boost::test_tools::assertion_result::assertion_result(&local_ae8,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b18,"str_persistence.find(value6) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_b08,plVar5,&local_b18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_ae8,&local_b08,&local_b28,0x6c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b08);
    boost::test_tools::assertion_result::~assertion_result(&local_ae8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b38,0x6d,&local_b48);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_158);
    boost::test_tools::assertion_result::assertion_result(&local_b60,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b90,"str_persistence.find(value7) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_b80,plVar5,&local_b90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ba0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_b60,&local_b80,&local_ba0,0x6d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b80);
    boost::test_tools::assertion_result::~assertion_result(&local_b60);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bb0,0x6e,&local_bc0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_180);
    boost::test_tools::assertion_result::assertion_result(&local_bd8,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c08,"str_persistence.find(value8) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_bf8,plVar5,&local_c08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_bd8,&local_bf8,&local_c18,0x6e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_bf8);
    boost::test_tools::assertion_result::~assertion_result(&local_bd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c28,0x6f,&local_c38);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_1a8);
    boost::test_tools::assertion_result::assertion_result(&local_c50,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c80,"str_persistence.find(value9) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_c70,plVar5,&local_c80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_c50,&local_c70,&local_c90,0x6f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c70);
    boost::test_tools::assertion_result::~assertion_result(&local_c50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar3 = std::operator<<((ostream *)&std::clog,"str_persistence=");
  poVar3 = std::operator<<(poVar3,(string *)local_310);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,value0.field_2._12_4_);
  poVar3 = std::operator<<(poVar3," MIN_PERS=2");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  test_persistence_abi_cxx11_(&local_cb0,value0.field_2._12_4_,2);
  std::__cxx11::string::operator=((string *)local_310,(string *)&local_cb0);
  std::__cxx11::string::~string((string *)&local_cb0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_cc0,0x77,&local_cd0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_ce8,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d18,"str_persistence.find(value0) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_d08,plVar5,&local_d18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_ce8,&local_d08,&local_d28,0x77,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d08);
    boost::test_tools::assertion_result::~assertion_result(&local_ce8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d38,0x78,&local_d48);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_d60,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d90,"str_persistence.find(value1) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_d80,plVar5,&local_d90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_da0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_d60,&local_d80,&local_da0,0x78,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d80);
    boost::test_tools::assertion_result::~assertion_result(&local_d60);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_db0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_dc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_db0,0x79,&local_dc0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_90);
    boost::test_tools::assertion_result::assertion_result(&local_dd8,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e08,"str_persistence.find(value2) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_df8,plVar5,&local_e08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_dd8,&local_df8,&local_e18,0x79,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_df8);
    boost::test_tools::assertion_result::~assertion_result(&local_dd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e28,0x7a,&local_e38);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_e50,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e80,"str_persistence.find(value3) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_e70,plVar5,&local_e80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_e50,&local_e70,&local_e90,0x7a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_e70);
    boost::test_tools::assertion_result::~assertion_result(&local_e50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ea0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_eb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ea0,0x7b,&local_eb0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_e0);
    boost::test_tools::assertion_result::assertion_result(&local_ec8,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ef8,"str_persistence.find(value4) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_ee8,plVar5,&local_ef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_ec8,&local_ee8,&local_f08,0x7b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_ee8);
    boost::test_tools::assertion_result::~assertion_result(&local_ec8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f28);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f18,0x7c,&local_f28);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_108);
    boost::test_tools::assertion_result::assertion_result(&local_f40,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f70,"str_persistence.find(value5) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_f60,plVar5,&local_f70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_f40,&local_f60,&local_f80,0x7c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_f60);
    boost::test_tools::assertion_result::~assertion_result(&local_f40);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_fa0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f90,0x7d,&local_fa0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_130);
    boost::test_tools::assertion_result::assertion_result(&local_fb8,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fe8,"str_persistence.find(value6) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_fd8,plVar5,&local_fe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ff8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_fb8,&local_fd8,&local_ff8,0x7d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_fd8);
    boost::test_tools::assertion_result::~assertion_result(&local_fb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1008,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1018);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1008,0x7e,&local_1018);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_158);
    boost::test_tools::assertion_result::assertion_result(&local_1030,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1060,"str_persistence.find(value7) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_1050,plVar5,&local_1060);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1070,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1030,&local_1050,&local_1070,0x7e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1050);
    boost::test_tools::assertion_result::~assertion_result(&local_1030);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1080,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1090);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1080,0x7f,&local_1090);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_180);
    boost::test_tools::assertion_result::assertion_result(&local_10a8,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10d8,"str_persistence.find(value8) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_10c8,plVar5,&local_10d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_10a8,&local_10c8,&local_10e8,0x7f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_10c8);
    boost::test_tools::assertion_result::~assertion_result(&local_10a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10f8,0x80,&local_1108);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_1a8);
    boost::test_tools::assertion_result::assertion_result(&local_1120,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1150,"str_persistence.find(value9) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_1140,plVar5,&local_1150);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1160,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1120,&local_1140,&local_1160,0x80,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1140);
    boost::test_tools::assertion_result::~assertion_result(&local_1120);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar3 = std::operator<<((ostream *)&std::clog,"str_persistence=");
  poVar3 = std::operator<<(poVar3,(string *)local_310);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,value0.field_2._12_4_);
  poVar3 = std::operator<<(poVar3," MIN_PERS=Inf");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  coefficient = value0.field_2._12_4_;
  min_persistence = std::numeric_limits<int>::max();
  test_persistence_abi_cxx11_(&local_1180,coefficient,min_persistence);
  std::__cxx11::string::operator=((string *)local_310,(string *)&local_1180);
  std::__cxx11::string::~string((string *)&local_1180);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1190,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1190,0x88,&local_11a0);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_11b8,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11e8,"str_persistence.find(value0) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_11d8,plVar5,&local_11e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_11b8,&local_11d8,&local_11f8,0x88,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_11d8);
    boost::test_tools::assertion_result::~assertion_result(&local_11b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1208,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1218);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1208,0x89,&local_1218);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_1230,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1260,"str_persistence.find(value1) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_1250,plVar5,&local_1260);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1270,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1230,&local_1250,&local_1270,0x89,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1250);
    boost::test_tools::assertion_result::~assertion_result(&local_1230);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1280,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1290);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1280,0x8a,&local_1290);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_90);
    boost::test_tools::assertion_result::assertion_result(&local_12a8,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12d8,"str_persistence.find(value2) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_12c8,plVar5,&local_12d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_12a8,&local_12c8,&local_12e8,0x8a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_12c8);
    boost::test_tools::assertion_result::~assertion_result(&local_12a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1308);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_12f8,0x8b,&local_1308);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_1320,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1350,"str_persistence.find(value3) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_1340,plVar5,&local_1350);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1360,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1320,&local_1340,&local_1360,0x8b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1340);
    boost::test_tools::assertion_result::~assertion_result(&local_1320);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1370,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1380);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1370,0x8c,&local_1380);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_e0);
    boost::test_tools::assertion_result::assertion_result(&local_1398,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13c8,"str_persistence.find(value4) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_13b8,plVar5,&local_13c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1398,&local_13b8,&local_13d8,0x8c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_13b8);
    boost::test_tools::assertion_result::~assertion_result(&local_1398);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_13f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_13e8,0x8d,&local_13f8);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_108);
    boost::test_tools::assertion_result::assertion_result(&local_1410,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1440,"str_persistence.find(value5) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_1430,plVar5,&local_1440);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1450,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1410,&local_1430,&local_1450,0x8d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1430);
    boost::test_tools::assertion_result::~assertion_result(&local_1410);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1460,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1470);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1460,0x8e,&local_1470);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_130);
    boost::test_tools::assertion_result::assertion_result(&local_1488,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_14b8,"str_persistence.find(value6) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_14a8,plVar5,&local_14b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_14c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1488,&local_14a8,&local_14c8,0x8e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_14a8);
    boost::test_tools::assertion_result::~assertion_result(&local_1488);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_14d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_14e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_14d8,0x8f,&local_14e8);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_158);
    boost::test_tools::assertion_result::assertion_result(&local_1500,lVar4 == -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1530,"str_persistence.find(value7) == std::string::npos",0x31);
    boost::unit_test::operator<<(&local_1520,plVar5,&local_1530);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1540,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1500,&local_1520,&local_1540,0x8f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1520);
    boost::test_tools::assertion_result::~assertion_result(&local_1500);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1550,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1560);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1550,0x90,&local_1560);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_180);
    boost::test_tools::assertion_result::assertion_result(&local_1578,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_15a8,"str_persistence.find(value8) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_1598,plVar5,&local_15a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_15b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_1578,&local_1598,&local_15b8,0x90,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1598);
    boost::test_tools::assertion_result::~assertion_result(&local_1578);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_15c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_15d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_15c8,0x91,&local_15d8);
    lVar4 = std::__cxx11::string::find((string *)local_310,(ulong)local_1a8);
    boost::test_tools::assertion_result::assertion_result(&local_15f0,lVar4 != -1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1620,"str_persistence.find(value9) != std::string::npos",0x31);
    boost::unit_test::operator<<(&local_1610,plVar5,&local_1620);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1630,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_15f0,&local_1610,&local_1630,0x91,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1610);
    boost::test_tools::assertion_result::~assertion_result(&local_15f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar3 = std::operator<<((ostream *)&std::clog,"str_persistence=");
  poVar3 = std::operator<<(poVar3,(string *)local_310);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void test_persistence_with_coeff_field(int coeff_field) {
  std::string value0("  0 0.02 1.12");
  std::string value1("  0 0.03 1.13");
  std::string value2("  0 0.04 1.14");
  std::string value3("  0 0.05 1.15");
  std::string value4("  0 0.06 1.16");
  std::string value5("  0 0.07 1.17");
  std::string value6("  0 0.08 1.18");
  std::string value7("  0 0.09 1.19");
  std::string value8("  0 0 inf"    );
  std::string value9("  0 0.01 inf" );

  value0.insert(0,std::to_string(coeff_field));
  value1.insert(0,std::to_string(coeff_field));
  value2.insert(0,std::to_string(coeff_field));
  value3.insert(0,std::to_string(coeff_field));
  value4.insert(0,std::to_string(coeff_field));
  value5.insert(0,std::to_string(coeff_field));
  value6.insert(0,std::to_string(coeff_field));
  value7.insert(0,std::to_string(coeff_field));
  value8.insert(0,std::to_string(coeff_field));
  value9.insert(0,std::to_string(coeff_field));

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=0" << std::endl;

  std::string str_persistence = test_persistence(coeff_field, 0);
  std::clog << str_persistence << std::endl;
  
  BOOST_CHECK(str_persistence.find(value0) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value1) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value2) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value3) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value4) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value5) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value6) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value7) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=1" << std::endl;

  str_persistence = test_persistence(coeff_field, 1);

  BOOST_CHECK(str_persistence.find(value0) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value1) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value2) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value3) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value4) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value5) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value6) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value7) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=2" << std::endl;

  str_persistence = test_persistence(coeff_field, 2);

  BOOST_CHECK(str_persistence.find(value0) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value1) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value2) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value3) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value4) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value5) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value6) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value7) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=Inf" << std::endl;

  str_persistence = test_persistence(coeff_field, (std::numeric_limits<int>::max)());

  BOOST_CHECK(str_persistence.find(value0) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value1) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value2) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value3) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value4) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value5) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value6) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value7) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;
}